

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MessageBuilder::MessageBuilder
          (MessageBuilder *this,StringRef *macroName,SourceLineInfo *lineInfo,OfType type)

{
  undefined4 in_ECX;
  undefined8 in_RDI;
  OfType _type;
  SourceLineInfo *in_stack_ffffffffffffffd0;
  StringRef *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  _type = (OfType)((ulong)in_RDI >> 0x20);
  MessageStream::MessageStream((MessageStream *)0x1306e5);
  MessageInfo::MessageInfo
            ((MessageInfo *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0,_type);
  return;
}

Assistant:

Catch::MessageBuilder::MessageBuilder( StringRef const& macroName,
                                           SourceLineInfo const& lineInfo,
                                           ResultWas::OfType type )
        :m_info(macroName, lineInfo, type) {}